

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LConvertBGRAToRGB565_C(uint32_t *src,int num_pixels,uint8_t *dst)

{
  uint uVar1;
  byte *pbVar2;
  uint8_t gb;
  uint8_t rg;
  uint32_t argb;
  uint32_t *src_end;
  uint8_t *dst_local;
  int num_pixels_local;
  uint32_t *src_local;
  
  dst_local = dst;
  src_local = src;
  while (src_local < src + num_pixels) {
    uVar1 = *src_local;
    pbVar2 = dst_local + 1;
    *dst_local = (byte)(uVar1 >> 0x10) & 0xf8 | (byte)(uVar1 >> 0xd) & 7;
    dst_local = dst_local + 2;
    *pbVar2 = (byte)(uVar1 >> 5) & 0xe0 | (byte)(uVar1 >> 3) & 0x1f;
    src_local = src_local + 1;
  }
  return;
}

Assistant:

void VP8LConvertBGRAToRGB565_C(const uint32_t* WEBP_RESTRICT src,
                               int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const uint32_t* const src_end = src + num_pixels;
  while (src < src_end) {
    const uint32_t argb = *src++;
    const uint8_t rg = ((argb >> 16) & 0xf8) | ((argb >> 13) & 0x7);
    const uint8_t gb = ((argb >>  5) & 0xe0) | ((argb >>  3) & 0x1f);
#if (WEBP_SWAP_16BIT_CSP == 1)
    *dst++ = gb;
    *dst++ = rg;
#else
    *dst++ = rg;
    *dst++ = gb;
#endif
  }
}